

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O3

void __thiscall
LiteScript::_Type_STRING::Load
          (_Type_STRING *this,istream *stream,Object *object,offset_in_Memory_to_subr caller)

{
  char cVar1;
  string str;
  string local_60;
  String local_40;
  
  Object::Reassign(object,(Type *)_type_string,0x20);
  String::String((String *)object->data);
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  while (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 2) == 0) {
    cVar1 = std::istream::get();
    if (cVar1 == '\0') break;
    std::__cxx11::string::push_back((char)&local_60);
  }
  String::String(&local_40,&local_60);
  String::operator=((String *)object->data,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_40.str._M_dataplus._M_p != &local_40.str.field_2) {
    operator_delete(local_40.str._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  return;
}

Assistant:

void LiteScript::_Type_STRING::Load(std::istream &stream, Object &object, unsigned int (Memory::*caller)(std::istream&)) const {
    object.Reassign(Type::STRING, sizeof(String));
    std::allocator<String> allocator;
    allocator.construct(&object.GetData<String>());
    std::string str;
    unsigned char c;
    while (!stream.eof() && (c = (unsigned char)stream.get()) != 0)
        str += c;
    object.GetData<String>() = String(str);
}